

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::AddItem(Character *this,short item,int amount)

{
  int iVar1;
  World *pWVar2;
  bool bVar3;
  size_type sVar4;
  pointer pCVar5;
  mapped_type *this_00;
  int *piVar6;
  value_type local_74;
  Character_Item newitem;
  allocator<char> local_59;
  key_type local_58;
  int local_34;
  _Self local_30;
  _Self local_28;
  iterator it;
  int amount_local;
  short item_local;
  Character *this_local;
  
  if (((amount < 1) || (item < 1)) ||
     (it._M_node._0_4_ = amount, it._M_node._6_2_ = item,
     sVar4 = std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::size
                       (&this->world->eif->data), sVar4 <= (ulong)(long)item)) {
    return false;
  }
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>
                 (&this->inventory);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::end<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>
                   (&this->inventory);
    bVar3 = std::operator!=(&local_28,&local_30);
    if (!bVar3) {
      local_74.id = it._M_node._6_2_;
      local_74.amount = (int)it._M_node;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::push_back
                (&this->inventory,&local_74);
      CalculateStats(this,true);
      return true;
    }
    pCVar5 = std::_List_iterator<Character_Item>::operator->(&local_28);
    if (pCVar5->id == it._M_node._6_2_) break;
    std::_List_iterator<Character_Item>::operator++(&local_28);
  }
  pCVar5 = std::_List_iterator<Character_Item>::operator->(&local_28);
  iVar1 = (int)it._M_node;
  if (-1 < pCVar5->amount + (int)it._M_node) {
    pCVar5 = std::_List_iterator<Character_Item>::operator->(&local_28);
    pCVar5->amount = pCVar5->amount + iVar1;
    pCVar5 = std::_List_iterator<Character_Item>::operator->(&local_28);
    pWVar2 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"MaxItem",&local_59);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar2->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_58);
    local_34 = util::variant::operator_cast_to_int(this_00);
    piVar6 = std::min<int>(&pCVar5->amount,&local_34);
    iVar1 = *piVar6;
    pCVar5 = std::_List_iterator<Character_Item>::operator->(&local_28);
    pCVar5->amount = iVar1;
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    CalculateStats(this,true);
    return true;
  }
  return false;
}

Assistant:

bool Character::AddItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount + amount < 0)
			{
				return false;
			}

			it->amount += amount;

			it->amount = std::min<int>(it->amount, this->world->config["MaxItem"]);

			this->CalculateStats();

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->inventory.push_back(newitem);

	this->CalculateStats();

	return true;
}